

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuAsyncArray.H
# Opt level: O2

void __thiscall
amrex::Gpu::AsyncArray<double,_0>::AsyncArray(AsyncArray<double,_0> *this,double *h_p,size_t n)

{
  int iVar1;
  Arena *pAVar2;
  undefined4 extraout_var;
  
  this->d_data = (double *)0x0;
  this->h_data = (double *)0x0;
  if (n != 0) {
    pAVar2 = The_Pinned_Arena();
    iVar1 = (*pAVar2->_vptr_Arena[2])(pAVar2,n << 3);
    this->h_data = (double *)CONCAT44(extraout_var,iVar1);
    memcpy((double *)CONCAT44(extraout_var,iVar1),h_p,n << 3);
    return;
  }
  return;
}

Assistant:

AsyncArray (T const* h_p, const std::size_t n)
    {
        if (n == 0) return;
        h_data = static_cast<T*>(The_Pinned_Arena()->alloc(n*sizeof(T)));
        std::memcpy(h_data, h_p, n*sizeof(T));
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion())
        {
            d_data = static_cast<T*>(The_Arena()->alloc(n*sizeof(T)));
            Gpu::htod_memcpy_async(d_data, h_data, n*sizeof(T));
        }
#endif
    }